

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  BYTE *s;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  LZ4_byte *pLVar11;
  ushort uVar12;
  LZ4_byte *pLVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte *__src;
  BYTE *e;
  ulong uVar19;
  BYTE *d;
  byte *pbVar20;
  byte *pbVar21;
  BYTE *d_1;
  ushort *puVar22;
  ushort *puVar23;
  int local_60;
  byte *local_38;
  
  uVar16 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar16 == 0) {
    iVar6 = LZ4_decompress_fast(source,dest,originalSize);
LAB_0011332a:
    if (0 < iVar6) {
      LZ4_streamDecode->table[3] = (long)originalSize;
      (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
    }
    return iVar6;
  }
  pLVar11 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  if (pLVar11 != (LZ4_byte *)dest) {
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar16;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar11 + -uVar16;
    iVar6 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar11 + -uVar16,uVar16);
    goto LAB_0011332a;
  }
  if ((uVar16 < 0xffff) && (LZ4_streamDecode->table[1] != 0)) {
    if (source == (char *)0x0) {
      return -1;
    }
    pLVar13 = (LZ4_streamDecode->internal_donotuse).externalDict + LZ4_streamDecode->table[1];
    if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
      pLVar13 = (LZ4_byte *)0x0;
    }
    if (originalSize == 0) {
      if (*source != '\0') {
        return -1;
      }
      local_60 = 1;
      lVar8 = 0;
      goto LAB_001133fd;
    }
    __src = (byte *)(dest + -uVar16);
    pbVar1 = (byte *)(dest + originalSize);
    local_60 = (int)source;
    pbVar21 = (byte *)dest;
    if (0x3f < originalSize) {
LAB_00113434:
      do {
        bVar3 = (byte)*(ushort *)source;
        uVar10 = (uint)bVar3;
        uVar7 = (uint)(bVar3 >> 4);
        if (uVar7 == 0xf) {
          uVar7 = 0;
          puVar23 = (ushort *)((long)source + 0x10);
          do {
            puVar22 = puVar23;
            uVar7 = uVar7 + *(byte *)((long)puVar22 + -0xf);
            puVar23 = (ushort *)((long)puVar22 + 1);
          } while (*(byte *)((long)puVar22 + -0xf) == 0xff);
          uVar16 = (ulong)uVar7;
          pbVar20 = pbVar21 + uVar16 + 0xf;
          if (dest + (long)originalSize + -8 < pbVar20) {
            uVar16 = uVar16 + 0xf;
            source = (char *)(puVar22 + -7);
            goto LAB_001137f8;
          }
          puVar23 = puVar22 + -7;
          do {
            *(undefined8 *)pbVar21 = *(undefined8 *)puVar23;
            pbVar21 = pbVar21 + 8;
            puVar23 = puVar23 + 4;
          } while (pbVar21 < pbVar20);
          puVar23 = (ushort *)((long)puVar22 + 1 + uVar16);
        }
        else {
          *(undefined8 *)pbVar21 = *(undefined8 *)((long)source + 1);
          if (0x8f < bVar3) {
            *(undefined8 *)(pbVar21 + 8) = *(undefined8 *)((long)source + 9);
          }
          pbVar20 = pbVar21 + uVar7;
          puVar23 = (ushort *)((byte *)((long)source + 1) + uVar7);
        }
        uVar12 = *puVar23;
        uVar16 = (ulong)uVar12;
        source = (char *)(puVar23 + 1);
        pbVar17 = pbVar20 + -uVar16;
        uVar19 = (ulong)(bVar3 & 0xf);
        if (uVar19 == 0xf) {
          uVar10 = 0;
          do {
            uVar5 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar10 = uVar10 + (byte)uVar5;
          } while ((byte)uVar5 == 0xff);
          uVar15 = (ulong)uVar10 + 0x13;
          if (pbVar1 + -0x40 <= pbVar20 + (ulong)uVar10 + 0x13) goto LAB_00113853;
        }
        else {
          uVar15 = uVar19 + 4;
          if (pbVar1 + -0x40 <= pbVar20 + uVar19 + 4) goto LAB_00113853;
          if ((__src <= pbVar17) && (7 < uVar12)) {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
            *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
            *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
            pbVar21 = pbVar20 + uVar19 + 4;
            goto LAB_00113434;
          }
        }
        pbVar2 = pbVar20 + uVar15;
        pbVar21 = pbVar2;
        if (pbVar17 < __src) {
          if (pbVar2 <= pbVar1 + -5) {
            uVar16 = (long)__src - (long)pbVar17;
            uVar19 = uVar15 - uVar16;
            if (uVar15 < uVar16 || uVar19 == 0) {
              memmove(pbVar20,pLVar13 + -uVar16,uVar15);
            }
            else {
              memcpy(pbVar20,pLVar13 + -uVar16,uVar16);
              pbVar21 = pbVar20 + uVar16;
              if ((ulong)((long)pbVar21 - (long)__src) < uVar19) {
                pbVar20 = __src;
                if (uVar16 < uVar15) {
                  do {
                    *pbVar21 = *pbVar20;
                    pbVar21 = pbVar21 + 1;
                    pbVar20 = pbVar20 + 1;
                  } while (pbVar21 < pbVar2);
                }
              }
              else {
                memcpy(pbVar21,__src,uVar19);
                pbVar21 = pbVar2;
              }
            }
            goto LAB_00113434;
          }
          goto LAB_00113747;
        }
        if (uVar12 < 0x10) {
          if (uVar16 == 4) {
            iVar6 = *(int *)pbVar17;
          }
          else if (uVar12 == 2) {
            iVar6 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
          }
          else {
            if (uVar12 != 1) {
              if (uVar12 < 8) {
                pbVar20[0] = 0;
                pbVar20[1] = 0;
                pbVar20[2] = 0;
                pbVar20[3] = 0;
                *pbVar20 = *pbVar17;
                pbVar20[1] = pbVar17[1];
                pbVar20[2] = pbVar17[2];
                pbVar20[3] = pbVar17[3];
                uVar10 = inc32table[uVar12];
                *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar17 + uVar10);
                pbVar17 = pbVar17 + ((ulong)uVar10 - (long)dec64table[uVar12]);
              }
              else {
                *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
                pbVar17 = pbVar17 + 8;
              }
              pbVar20 = pbVar20 + 8;
              do {
                *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
                pbVar20 = pbVar20 + 8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar20 < pbVar2);
              goto LAB_00113434;
            }
            iVar6 = (uint)*pbVar17 * 0x1010101;
          }
          *(int *)pbVar20 = iVar6;
          *(int *)(pbVar20 + 4) = iVar6;
          if (8 < uVar15) {
            pbVar20 = pbVar20 + 8;
            do {
              *(int *)pbVar20 = iVar6;
              *(int *)(pbVar20 + 4) = iVar6;
              pbVar20 = pbVar20 + 8;
            } while (pbVar20 < pbVar2);
          }
          goto LAB_00113434;
        }
        do {
          uVar4 = *(undefined8 *)(pbVar20 + -uVar16 + 8);
          *(undefined8 *)pbVar20 = *(undefined8 *)(pbVar20 + -uVar16);
          *(undefined8 *)(pbVar20 + 8) = uVar4;
          uVar4 = *(undefined8 *)(pbVar20 + -uVar16 + 0x10 + 8);
          *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)(pbVar20 + -uVar16 + 0x10);
          *(undefined8 *)(pbVar20 + 0x18) = uVar4;
          pbVar20 = pbVar20 + 0x20;
        } while (pbVar20 < pbVar2);
      } while( true );
    }
    while( true ) {
      bVar3 = (byte)*(ushort *)source;
      source = (char *)((long)source + 1);
      while( true ) {
        uVar10 = (uint)bVar3;
        uVar16 = (ulong)(bVar3 >> 4);
        if ((0x8f < uVar10) || (dest + (long)originalSize + -0x1a < pbVar21)) break;
        *(undefined8 *)pbVar21 = *(undefined8 *)source;
        pbVar20 = pbVar21 + uVar16;
        uVar15 = (ulong)(uVar10 & 0xf);
        puVar23 = (ushort *)((long)source + uVar16);
        uVar12 = *puVar23;
        pbVar17 = pbVar20 + -(ulong)uVar12;
        if ((((uVar10 & 0xf) == 0xf) || (uVar12 < 8)) || (pbVar17 < __src)) goto LAB_0011382f;
        *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
        *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
        *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
        pbVar21 = pbVar20 + uVar15 + 4;
        bVar3 = *(byte *)((long)source + uVar16 + 2);
        source = (char *)((long)source + uVar16 + 3);
      }
      if (bVar3 >> 4 == 0xf) {
        uVar7 = 0;
        do {
          uVar12 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar7 = uVar7 + (byte)uVar12;
        } while ((byte)uVar12 == 0xff);
        uVar16 = (ulong)uVar7 + 0xf;
      }
      pbVar20 = pbVar21 + uVar16;
LAB_001137f8:
      puVar23 = (ushort *)source;
      if (dest + (long)originalSize + -8 < pbVar20) break;
      do {
        *(undefined8 *)pbVar21 = *(undefined8 *)puVar23;
        pbVar21 = pbVar21 + 8;
        puVar23 = puVar23 + 4;
      } while (pbVar21 < pbVar20);
      puVar23 = (ushort *)((long)source + uVar16);
      uVar12 = *puVar23;
      pbVar17 = pbVar20 + -(ulong)uVar12;
      uVar15 = (ulong)(uVar10 & 0xf);
LAB_0011382f:
      source = (char *)(puVar23 + 1);
      if ((int)uVar15 == 0xf) {
        uVar10 = 0;
        do {
          uVar5 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar10 = uVar10 + (byte)uVar5;
        } while ((byte)uVar5 == 0xff);
        uVar15 = (ulong)uVar10 + 0xf;
      }
      uVar15 = uVar15 + 4;
LAB_00113853:
      pbVar2 = pbVar20 + uVar15;
      pbVar21 = pbVar2;
      if (pbVar17 < __src) {
        if (pbVar1 + -5 < pbVar2) goto LAB_00113747;
        uVar16 = (long)__src - (long)pbVar17;
        uVar19 = uVar15 - uVar16;
        if (uVar15 < uVar16 || uVar19 == 0) {
          memmove(pbVar20,pLVar13 + -uVar16,uVar15);
        }
        else {
          memcpy(pbVar20,pLVar13 + -uVar16,uVar16);
          pbVar21 = pbVar20 + uVar16;
          if ((ulong)((long)pbVar21 - (long)__src) < uVar19) {
            pbVar20 = __src;
            if (uVar16 < uVar15) {
              do {
                *pbVar21 = *pbVar20;
                pbVar21 = pbVar21 + 1;
                pbVar20 = pbVar20 + 1;
              } while (pbVar21 < pbVar2);
            }
          }
          else {
            memcpy(pbVar21,__src,uVar19);
            pbVar21 = pbVar2;
          }
        }
      }
      else {
        if (uVar12 < 8) {
          LZ4_decompress_fast_continue_cold_1();
          pbVar17 = local_38;
        }
        else {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
          pbVar17 = pbVar17 + 8;
        }
        pbVar9 = pbVar20 + 8;
        if (pbVar1 + -0xc < pbVar2) {
          if (pbVar1 + -5 < pbVar2) goto LAB_00113747;
          pbVar20 = pbVar1 + -7;
          pbVar14 = pbVar17;
          pbVar18 = pbVar9;
          if (pbVar9 < pbVar20) {
            do {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
              pbVar18 = pbVar18 + 8;
              pbVar14 = pbVar14 + 8;
            } while (pbVar18 < pbVar20);
            pbVar17 = pbVar17 + ((long)pbVar20 - (long)pbVar9);
            pbVar9 = pbVar20;
          }
          for (; pbVar9 < pbVar2; pbVar9 = pbVar9 + 1) {
            bVar3 = *pbVar17;
            pbVar17 = pbVar17 + 1;
            *pbVar9 = bVar3;
          }
        }
        else {
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar17;
          if (0x10 < uVar15) {
            pbVar20 = pbVar20 + 0x10;
            do {
              pbVar17 = pbVar17 + 8;
              *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
              pbVar20 = pbVar20 + 8;
            } while (pbVar20 < pbVar2);
          }
        }
      }
    }
    if (pbVar20 == pbVar1) {
      memmove(pbVar21,source,uVar16);
      local_60 = ((int)source + (int)uVar16) - local_60;
      goto LAB_001133eb;
    }
LAB_00113747:
    local_60 = ~(uint)source + local_60;
  }
  else {
    local_60 = LZ4_decompress_fast(source,dest,originalSize);
  }
LAB_001133eb:
  if (local_60 < 1) {
    return local_60;
  }
  pLVar11 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  uVar16 = LZ4_streamDecode->table[3];
  lVar8 = (long)originalSize;
LAB_001133fd:
  LZ4_streamDecode->table[3] = uVar16 + lVar8;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = pLVar11 + lVar8;
  return local_60;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        if (lz4sd->prefixSize >= 64 KB - 1 || lz4sd->extDictSize == 0)
            result = LZ4_decompress_fast(source, dest, originalSize);
        else
            result = LZ4_decompress_fast_doubleDict(source, dest, originalSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}